

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_find_files.cpp
# Opt level: O1

bool __thiscall
crnlib::find_files::find_internal
          (find_files *this,char *pBasepath,char *pRelpath,char *pFilespec,uint flags,int level)

{
  dynamic_string *this_00;
  byte bVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  DIR *__dirp;
  dirent *pdVar7;
  file_desc *pfVar8;
  uint uVar9;
  char *pcVar10;
  file_desc *pfVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  dynamic_string_array paths;
  dynamic_string filename;
  dynamic_string pathname;
  elemental_vector local_a8;
  find_files *local_98;
  dynamic_string local_90;
  uint local_7c;
  dynamic_string local_78;
  char *local_68;
  char *local_60;
  char *local_58;
  ulong local_50;
  DIR *local_48;
  dynamic_string local_40;
  
  local_78.m_buf_size = 0;
  local_78.m_len = 0;
  local_78.m_pStr = (char *)0x0;
  local_98 = this;
  local_58 = pFilespec;
  if (*pRelpath == '\0') {
    dynamic_string::set(&local_78,pBasepath,0xffffffff);
  }
  else {
    file_utils::combine_path(&local_78,pBasepath,pRelpath);
  }
  if ((local_78.m_len != 0) && (local_78.m_pStr[local_78.m_len - 1] != '/')) {
    dynamic_string::append(&local_78,"/");
  }
  pcVar10 = local_78.m_pStr;
  if (local_78.m_pStr == (char *)0x0) {
    pcVar10 = "";
  }
  __dirp = opendir(pcVar10);
  if (__dirp == (DIR *)0x0) {
    bVar5 = level != 0;
  }
  else {
    local_a8.m_p = (void *)0x0;
    local_a8.m_size = 0;
    local_a8.m_capacity = 0;
    local_7c = flags;
    local_68 = pBasepath;
    local_60 = pRelpath;
    local_48 = __dirp;
    do {
      pdVar7 = readdir(__dirp);
      if (pdVar7 == (dirent *)0x0) break;
      pcVar10 = pdVar7->d_name;
      iVar6 = strcmp(pcVar10,".");
      if ((iVar6 != 0) && (iVar6 = strcmp(pcVar10,".."), iVar6 != 0)) {
        bVar1 = pdVar7->d_type;
        dynamic_string::dynamic_string(&local_90,pcVar10);
        if (((flags & 1) != 0) && ((bVar1 & 4) != 0)) {
          if (local_a8.m_capacity <= local_a8.m_size) {
            elemental_vector::increase_capacity
                      (&local_a8,local_a8.m_size + 1,true,0x10,(object_mover)0x0,false);
          }
          dynamic_string::dynamic_string
                    ((dynamic_string *)((local_a8._8_8_ & 0xffffffff) * 0x10 + (long)local_a8.m_p),
                     &local_90);
          local_a8.m_size = local_a8.m_size + 1;
        }
        if (((byte)((byte)flags >> 2 & (byte)((bVar1 & 8) >> 3)) != 0) ||
           ((flags & 2) != 0 && (bVar1 & 4) != 0)) {
          pcVar10 = local_90.m_pStr;
          if (local_90.m_pStr == (char *)0x0) {
            pcVar10 = "";
          }
          iVar6 = fnmatch(local_58,pcVar10,0);
          if (iVar6 == 0) {
            uVar13 = (local_98->m_files).m_size;
            local_50 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            if (uVar13 == 0) {
              pfVar11 = (local_98->m_files).m_p;
              lVar14 = 0x47ffffffb8;
              do {
                file_desc::~file_desc(pfVar11);
                pfVar11 = pfVar11 + 1;
                lVar14 = lVar14 + -0x48;
              } while (lVar14 != 0);
            }
            else {
              if ((local_98->m_files).m_capacity < uVar13) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)local_98,uVar13,true,0x48,
                           vector<crnlib::find_files::file_desc>::object_mover,false);
              }
              uVar2 = (local_98->m_files).m_size;
              uVar9 = uVar13 - uVar2;
              if (uVar9 != 0) {
                pfVar8 = (local_98->m_files).m_p + uVar2;
                pfVar11 = pfVar8 + uVar9;
                do {
                  (pfVar8->m_fullname).m_buf_size = 0;
                  (pfVar8->m_fullname).m_len = 0;
                  (pfVar8->m_fullname).m_pStr = (char *)0x0;
                  (pfVar8->m_base).m_buf_size = 0;
                  (pfVar8->m_base).m_len = 0;
                  (pfVar8->m_base).m_pStr = (char *)0x0;
                  (pfVar8->m_rel).m_buf_size = 0;
                  (pfVar8->m_rel).m_len = 0;
                  (pfVar8->m_rel).m_pStr = (char *)0x0;
                  (pfVar8->m_name).m_buf_size = 0;
                  (pfVar8->m_name).m_len = 0;
                  (pfVar8->m_name).m_pStr = (char *)0x0;
                  pfVar8->m_is_dir = false;
                  pfVar8 = pfVar8 + 1;
                } while (pfVar8 != pfVar11);
              }
            }
            uVar12 = local_50;
            (local_98->m_files).m_size = uVar13;
            pfVar11 = (local_98->m_files).m_p;
            this_00 = &pfVar11[local_50].m_base;
            *(bool *)(this_00 + 3) = SUB41((bVar1 & 4) >> 2,0);
            dynamic_string::set(this_00,local_68,0xffffffff);
            pfVar11 = pfVar11 + uVar12;
            dynamic_string::set(&pfVar11->m_rel,local_60,0xffffffff);
            dynamic_string::set(&pfVar11->m_name,&local_90,0xffffffff);
            operator+((crnlib *)&local_40,&local_78,&local_90);
            dynamic_string::set(&pfVar11->m_fullname,&local_40,0xffffffff);
            flags = local_7c;
            if ((local_40.m_pStr != (char *)0x0) &&
               ((*(uint *)(local_40.m_pStr + -8) ^ *(uint *)(local_40.m_pStr + -4)) == 0xffffffff))
            {
              crnlib_free(local_40.m_pStr + -0x10);
            }
          }
        }
        pRelpath = local_60;
        __dirp = local_48;
        if ((local_90.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_90.m_pStr + -8) ^ *(uint *)(local_90.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_90.m_pStr + -0x10);
          pRelpath = local_60;
          __dirp = local_48;
        }
      }
    } while (pdVar7 != (dirent *)0x0);
    closedir(__dirp);
    bVar5 = true;
    if (((flags & 1) != 0) && (local_a8.m_size != 0)) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        local_90.m_buf_size = 0;
        local_90.m_len = 0;
        local_90.m_pStr = (char *)0x0;
        if (*pRelpath == '\0') {
          dynamic_string::set(&local_90,(dynamic_string *)((long)local_a8.m_p + lVar14),0xffffffff);
        }
        else {
          pcVar10 = *(char **)((long)local_a8.m_p + lVar14 + 8);
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "";
          }
          file_utils::combine_path(&local_90,pRelpath,pcVar10);
        }
        pcVar10 = local_90.m_pStr;
        if (local_90.m_pStr == (char *)0x0) {
          pcVar10 = "";
        }
        bVar5 = find_internal(local_98,local_68,pcVar10,local_58,local_7c,level + 1);
        if ((local_90.m_pStr != (char *)0x0) &&
           ((*(uint *)(local_90.m_pStr + -8) ^ *(uint *)(local_90.m_pStr + -4)) == 0xffffffff)) {
          crnlib_free(local_90.m_pStr + -0x10);
        }
        if (!bVar5) break;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar12 < (local_a8._8_8_ & 0xffffffff));
    }
    pvVar4 = local_a8.m_p;
    if (local_a8.m_p != (void *)0x0) {
      uVar12 = local_a8._8_8_ & 0xffffffff;
      if (uVar12 != 0) {
        lVar14 = 0;
        do {
          lVar3 = *(long *)((long)pvVar4 + lVar14 + 8);
          if ((lVar3 != 0) && ((*(uint *)(lVar3 + -8) ^ *(uint *)(lVar3 + -4)) == 0xffffffff)) {
            crnlib_free((void *)(lVar3 + -0x10));
          }
          lVar14 = lVar14 + 0x10;
        } while (uVar12 << 4 != lVar14);
      }
      crnlib_free(local_a8.m_p);
    }
  }
  if ((local_78.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_78.m_pStr + -8) ^ *(uint *)(local_78.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_78.m_pStr + -0x10);
  }
  return bVar5;
}

Assistant:

bool find_files::find_internal(const char* pBasepath, const char* pRelpath, const char* pFilespec, uint flags, int level)
    {
        dynamic_string pathname;
        if (strlen(pRelpath))
        {
            file_utils::combine_path(pathname, pBasepath, pRelpath);
        }
        else
        {
            pathname = pBasepath;
        }

        if (!pathname.is_empty())
        {
            char c = pathname.back();
            if (c != '/')
            {
                pathname += "/";
            }
        }

        DIR* dp = opendir(pathname.get_ptr());

        if (!dp)
        {
            return level ? true : false;
        }

        dynamic_string_array paths;

        for (;;)
        {
            struct dirent* ep = readdir(dp);
            if (!ep)
            {
                break;
            }
            if ((strcmp(ep->d_name, ".") == 0) || (strcmp(ep->d_name, "..") == 0))
            {
                continue;
            }

            const bool is_directory = (ep->d_type & DT_DIR) != 0;
            const bool is_file = (ep->d_type & DT_REG) != 0;

            dynamic_string filename(ep->d_name);

            if (is_directory)
            {
                if (flags & cFlagRecursive)
                {
                    paths.push_back(filename);
                }
            }

            if (((is_file) && (flags & cFlagAllowFiles)) || ((is_directory) && (flags & cFlagAllowDirs)))
            {
                if (0 == fnmatch(pFilespec, filename.get_ptr(), 0))
                {
                    m_files.resize(m_files.size() + 1);
                    file_desc& file = m_files.back();
                    file.m_is_dir = is_directory;
                    file.m_base = pBasepath;
                    file.m_rel = pRelpath;
                    file.m_name = filename;
                    file.m_fullname = pathname + filename;
                }
            }
        }

        closedir(dp);
        dp = nullptr;

        if (flags & cFlagRecursive)
        {
            for (uint i = 0; i < paths.size(); i++)
            {
                dynamic_string childpath;
                if (strlen(pRelpath))
                {
                    file_utils::combine_path(childpath, pRelpath, paths[i].get_ptr());
                }
                else
                {
                    childpath = paths[i];
                }

                if (!find_internal(pBasepath, childpath.get_ptr(), pFilespec, flags, level + 1))
                {
                    return false;
                }
            }
        }

        return true;
    }